

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2tls_max(long *val,char *str)

{
  int iVar1;
  long lVar2;
  
  if (str == (char *)0x0) {
    return PARAM_REQUIRES_PARAMETER;
  }
  lVar2 = 8;
  do {
    iVar1 = strcmp(str,*(char **)((long)post_per_transfer::m + lVar2 + 0x28));
    if (iVar1 == 0) {
      *val = *(long *)((long)&str2tls_max::tls_max_array[0].tls_max_str + lVar2);
      return PARAM_OK;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x58);
  return PARAM_BAD_USE;
}

Assistant:

ParameterError str2tls_max(long *val, const char *str)
{
   static struct s_tls_max {
    const char *tls_max_str;
    long tls_max;
  } const tls_max_array[] = {
    { "default", CURL_SSLVERSION_MAX_DEFAULT },
    { "1.0",     CURL_SSLVERSION_MAX_TLSv1_0 },
    { "1.1",     CURL_SSLVERSION_MAX_TLSv1_1 },
    { "1.2",     CURL_SSLVERSION_MAX_TLSv1_2 },
    { "1.3",     CURL_SSLVERSION_MAX_TLSv1_3 }
  };
  size_t i = 0;
  if(!str)
    return PARAM_REQUIRES_PARAMETER;
  for(i = 0; i < CURL_ARRAYSIZE(tls_max_array); i++) {
    if(!strcmp(str, tls_max_array[i].tls_max_str)) {
      *val = tls_max_array[i].tls_max;
      return PARAM_OK;
    }
  }
  return PARAM_BAD_USE;
}